

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  byte *pbVar1;
  connectdata *pcVar2;
  WildcardData *pWVar3;
  undefined8 *puVar4;
  FILEPROTO *pFVar5;
  WildcardData *pWVar6;
  byte bVar7;
  _Bool connected;
  CURLcode CVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  ftp_wc *pfVar12;
  ftp_parselist_data *pfVar13;
  uchar uVar14;
  
  pcVar2 = data->conn;
  *done = false;
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xdf;
  if (((data->state).field_0x74c & 0x40) != 0) {
    pWVar3 = data->wildcard;
    pcVar2 = data->conn;
switchD_0012e591_default:
    switch(pWVar3->state) {
    case '\0':
    case '\x06':
    case '\a':
      goto switchD_0012e591_caseD_0;
    case '\x01':
      pFVar5 = (data->req).p.file;
      pcVar9 = pFVar5->path;
      pWVar6 = data->wildcard;
      pcVar11 = strrchr(pcVar9,0x2f);
      if (pcVar11 == (char *)0x0) {
        if (*pcVar9 != '\0') {
          pcVar11 = (*Curl_cstrdup)(pcVar9);
          pWVar6->pattern = pcVar11;
          goto LAB_0012e808;
        }
LAB_0012e8e9:
        pWVar6->state = '\x04';
        CVar8 = ftp_parse_url_path(data);
      }
      else {
        if (pcVar11[1] == '\0') goto LAB_0012e8e9;
        pcVar9 = pcVar11 + 1;
        pcVar11 = (*Curl_cstrdup)(pcVar9);
        pWVar6->pattern = pcVar11;
LAB_0012e808:
        if (pcVar11 == (char *)0x0) {
          CVar8 = CURLE_OUT_OF_MEMORY;
        }
        else {
          *pcVar9 = '\0';
          pfVar12 = (ftp_wc *)(*Curl_ccalloc)(1,0x18);
          if (pfVar12 == (ftp_wc *)0x0) {
            CVar8 = CURLE_OUT_OF_MEMORY;
          }
          else {
            pfVar13 = Curl_ftp_parselist_data_alloc();
            pfVar12->parser = pfVar13;
            if (pfVar13 == (ftp_parselist_data *)0x0) {
              CVar8 = CURLE_OUT_OF_MEMORY;
            }
            else {
              pWVar6->ftpwc = pfVar12;
              pWVar6->dtor = wc_data_dtor;
              if ((data->set).ftp_filemethod == '\x02') {
                (data->set).ftp_filemethod = '\x01';
              }
              CVar8 = ftp_parse_url_path(data);
              if (CVar8 == CURLE_OK) {
                pcVar9 = (*Curl_cstrdup)(pFVar5->path);
                pWVar6->path = pcVar9;
                CVar8 = CURLE_OUT_OF_MEMORY;
                if (pcVar9 != (char *)0x0) {
                  (pfVar12->backup).write_function = (data->set).fwrite_func;
                  (data->set).fwrite_func = Curl_ftp_parselist;
                  (pfVar12->backup).file_descriptor = (FILE *)(data->set).out;
                  (data->set).out = data;
                  CVar8 = CURLE_OK;
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    CVar8 = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started");
                  }
                  goto LAB_0012e957;
                }
              }
            }
            Curl_ftp_parselist_data_free((ftp_parselist_data **)pfVar12);
            (*Curl_cfree)(pfVar12);
          }
          (*Curl_cfree)(pWVar6->pattern);
          pWVar6->pattern = (char *)0x0;
          pWVar6->ftpwc = (ftp_wc *)0x0;
          pWVar6->dtor = (wildcard_dtor)0x0;
        }
      }
LAB_0012e957:
      if (pWVar3->state != '\x04') {
        bVar7 = (CVar8 != CURLE_OK) << 2 | 2;
        goto LAB_0012e968;
      }
      goto LAB_0012e96b;
    case '\x02':
      pfVar12 = pWVar3->ftpwc;
      (data->set).fwrite_func = (pfVar12->backup).write_function;
      (data->set).out = (pfVar12->backup).file_descriptor;
      (pfVar12->backup).write_function = (curl_write_callback)0x0;
      (pfVar12->backup).file_descriptor = (FILE *)0x0;
      pWVar3->state = '\x03';
      CVar8 = Curl_ftp_parselist_geterror(pfVar12->parser);
      uVar14 = '\x04';
      if (CVar8 == CURLE_OK) {
        if ((pWVar3->filelist).size == 0) {
          pWVar3->state = '\x04';
          CVar8 = CURLE_REMOTE_FILE_NOT_FOUND;
          goto LAB_0012e96b;
        }
        goto switchD_0012e591_default;
      }
      break;
    case '\x03':
      puVar4 = (undefined8 *)((pWVar3->filelist).head)->ptr;
      pFVar5 = (data->req).p.file;
      pcVar9 = curl_maprintf("%s%s",pWVar3->path,*puVar4);
      if (pcVar9 == (char *)0x0) {
        CVar8 = CURLE_OUT_OF_MEMORY;
        goto LAB_0012e96b;
      }
      (*Curl_cfree)(pFVar5->freepath);
      pFVar5->path = pcVar9;
      pFVar5->freepath = pcVar9;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"Wildcard - START of \"%s\"",*puVar4);
      }
      if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(data,true);
        lVar10 = (*(data->set).chunk_bgn)
                           (puVar4,(data->set).wildcardptr,(int)(pWVar3->filelist).size);
        Curl_set_in_callback(data,false);
        if (lVar10 == 2) {
          uVar14 = '\x05';
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar4);
          }
          break;
        }
        if (lVar10 == 1) {
          CVar8 = CURLE_CHUNK_FAILED;
          goto LAB_0012e96b;
        }
      }
      uVar14 = '\x05';
      if (*(int *)(puVar4 + 1) == 0) {
        if ((*(byte *)(puVar4 + 0xc) & 0x40) != 0) {
          (pcVar2->proto).ftpc.known_filesize = puVar4[5];
        }
        CVar8 = ftp_parse_url_path(data);
        if (CVar8 == CURLE_OK) {
          CVar8 = CURLE_OK;
          Curl_llist_remove(&pWVar3->filelist,(pWVar3->filelist).head,(void *)0x0);
          if ((pWVar3->filelist).size == 0) {
            pWVar3->state = '\x04';
          }
        }
        goto LAB_0012e96b;
      }
      break;
    case '\x04':
      if (pWVar3->ftpwc == (ftp_wc *)0x0) {
        bVar7 = 7;
        CVar8 = CURLE_OK;
      }
      else {
        CVar8 = Curl_ftp_parselist_geterror(pWVar3->ftpwc->parser);
        bVar7 = CVar8 == CURLE_OK | 6;
      }
LAB_0012e968:
      pWVar3->state = bVar7;
      goto LAB_0012e96b;
    case '\x05':
      if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
        Curl_set_in_callback(data,true);
        (*(data->set).chunk_end)((data->set).wildcardptr);
        Curl_set_in_callback(data,false);
      }
      Curl_llist_remove(&pWVar3->filelist,(pWVar3->filelist).head,(void *)0x0);
      uVar14 = ((pWVar3->filelist).size == 0) + '\x03';
      break;
    default:
      goto switchD_0012e591_default;
    }
    pWVar3->state = uVar14;
    goto switchD_0012e591_default;
  }
  CVar8 = ftp_parse_url_path(data);
joined_r0x0012e98e:
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  pcVar2 = data->conn;
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 | 4;
  if (((data->req).field_0xbc & 0x10) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *done = false;
  CVar8 = ftp_state_quote(data,true,'\f');
  if (CVar8 == CURLE_OK) {
    CVar8 = ftp_multi_statemach(data,done);
    connected = Curl_conn_is_connected(data->conn,1);
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"ftp_perform ends with SECONDARY: %d",(ulong)connected);
    }
    if (CVar8 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar8 = ftp_dophase_done(data,connected);
      return CVar8;
    }
  }
  freedirs(&(pcVar2->proto).ftpc);
  return CVar8;
switchD_0012e591_caseD_0:
  CVar8 = CURLE_OK;
  if (pWVar3->dtor != (wildcard_dtor)0x0) {
    (*pWVar3->dtor)(pWVar3->ftpwc);
    pWVar3->ftpwc = (ftp_wc *)0x0;
  }
LAB_0012e96b:
  if ((data->wildcard->state | 2) == 7) {
    return CURLE_OK;
  }
  goto joined_r0x0012e98e;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}